

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonrd_opt.c
# Opt level: O2

void av1_block_yrd_idtx(MACROBLOCK *x,uint8_t *pred_buf,int pred_stride,RD_STATS *this_rdc,
                       int *skippable,BLOCK_SIZE bsize,TX_SIZE tx_size)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  MACROBLOCK *pMVar5;
  ulong uVar6;
  int16_t *piVar7;
  int64_t iVar8;
  ulong uVar9;
  ushort uVar10;
  int16_t *piVar11;
  long lVar12;
  uint uVar13;
  long lVar14;
  undefined7 in_register_00000089;
  int iVar15;
  int iVar16;
  uint uVar17;
  bool bVar18;
  uint16_t eob [1];
  tran_low_t coeff_buf [256];
  tran_low_t qcoeff_buf [256];
  tran_low_t dqcoeff_buf [256];
  int local_d10;
  ushort local_d0a;
  ulong local_d08;
  MACROBLOCK *local_d00;
  int local_cf4;
  int local_cf0;
  int local_cec;
  int local_ce8;
  uint local_ce4;
  ulong local_ce0;
  long local_cd8;
  SCAN_ORDER *local_cd0;
  long local_cc8;
  long local_cc0;
  ulong local_cb8;
  RD_STATS *local_cb0;
  long local_ca8;
  uint *local_ca0;
  long local_c98;
  ulong local_c90;
  long local_c88;
  int16_t local_c80 [512];
  ushort local_880 [512];
  int16_t local_480 [552];
  
  uVar6 = CONCAT71(in_register_00000089,bsize) & 0xffffffff;
  bVar2 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[uVar6];
  local_ce0 = (ulong)bVar2;
  iVar15 = 1 << (tx_size & 0x1f);
  bVar3 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[uVar6];
  iVar16 = (x->e_mbd).mb_to_right_edge;
  iVar4 = (x->e_mbd).mb_to_bottom_edge;
  bVar1 = tx_size - 1;
  if (bVar1 < 4) {
    local_cd0 = (SCAN_ORDER *)(&PTR_av1_fast_idtx_scan_order_8x8_00549c40)[bVar1];
    local_d10 = *(int *)(&DAT_0045bac0 + (ulong)bVar1 * 4);
  }
  else {
    local_d10 = 4;
    local_cd0 = &av1_fast_idtx_scan_order_4x4;
  }
  local_cc0 = (long)(iVar16 >> 0x1f & iVar16 >> 5) + local_ce0;
  local_cd8 = (long)(iVar4 >> 0x1f & iVar4 >> 5) + (ulong)bVar3;
  this_rdc->dist = 0;
  this_rdc->rate = 0;
  local_d00 = x;
  local_ca0 = (uint *)skippable;
  (*aom_subtract_block)
            ((uint)bVar3 << 2,(uint)bVar2 * 4,x->plane[0].src_diff,(ulong)((uint)bVar2 * 4),
             x->plane[0].src.buf,(long)x->plane[0].src.stride,pred_buf,(long)pred_stride);
  pMVar5 = local_d00;
  local_c90 = (ulong)(uint)(local_d10 * local_d10);
  local_cb8 = (ulong)(uint)(0x10 << (tx_size * '\x02' & 0x1f));
  local_cc8 = (long)iVar15;
  local_cf4 = iVar15 * (uint)bVar2 * 0x10;
  local_cf0 = iVar15 * 4;
  uVar6 = (ulong)bVar2;
  local_d08 = 0;
  iVar16 = 0 << (tx_size & 0x1f);
  local_cb0 = this_rdc;
  local_ce4 = 1;
  for (local_c98 = 0; local_c98 < local_cd8; local_c98 = local_c98 + local_cc8) {
    local_c88 = local_c98 * local_ce0;
    uVar9 = local_d08;
    for (local_ca8 = 0; local_ca8 < local_cc0; local_ca8 = local_ca8 + local_cc8) {
      local_cec = (int)uVar9;
      piVar7 = local_d00->plane[0].src_diff;
      if (local_d10 == 4) {
        piVar7 = piVar7 + local_cec;
        piVar11 = local_c80;
        for (lVar12 = 0; lVar12 != 4; lVar12 = lVar12 + 1) {
          for (lVar14 = 0; lVar14 != 4; lVar14 = lVar14 + 1) {
            piVar11[lVar14] = piVar7[lVar14] << 3;
          }
          piVar11 = piVar11 + 4;
          piVar7 = piVar7 + uVar6 * 4;
        }
      }
      else if (local_d10 == 8) {
        piVar7 = piVar7 + local_cec;
        piVar11 = local_c80;
        for (lVar12 = 0; lVar12 != 8; lVar12 = lVar12 + 1) {
          for (lVar14 = 0; lVar14 != 8; lVar14 = lVar14 + 1) {
            piVar11[lVar14] = piVar7[lVar14] << 3;
          }
          piVar11 = piVar11 + 8;
          piVar7 = piVar7 + uVar6 * 4;
        }
      }
      else if (local_d10 == 0x10) {
        piVar7 = piVar7 + local_cec;
        piVar11 = local_c80;
        for (lVar12 = 0; lVar12 != 0x10; lVar12 = lVar12 + 1) {
          for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 1) {
            piVar11[lVar14] = piVar7[lVar14] << 3;
          }
          piVar11 = piVar11 + 0x10;
          piVar7 = piVar7 + uVar6 * 4;
        }
      }
      local_ce8 = iVar16;
      (*av1_quantize_lp)(local_c80,local_c90,pMVar5->plane[0].round_fp_QTX,
                         pMVar5->plane[0].quant_fp_QTX,(int16_t *)local_880,local_480,
                         pMVar5->plane[0].dequant_QTX,&local_d0a,local_cd0->scan,local_cd0->iscan);
      bVar18 = local_d0a == 0;
      uVar13 = (uint)local_d0a;
      (pMVar5->txfm_search_info).blk_skip[local_c88 + local_ca8] = uVar13 == 0;
      if (uVar13 != 0) {
        if (uVar13 == 1) {
          uVar10 = -local_880[0];
          if (0 < (short)local_880[0]) {
            uVar10 = local_880[0];
          }
          uVar17 = (uint)uVar10;
        }
        else {
          uVar17 = (*aom_satd_lp)((int16_t *)local_880,(int)local_cb8);
        }
        local_cb0->rate = local_cb0->rate + uVar17;
      }
      uVar17 = local_ce4 & bVar18;
      iVar16 = 0x1f;
      if (uVar13 + 1 != 0) {
        for (; uVar13 + 1 >> iVar16 == 0; iVar16 = iVar16 + -1) {
        }
      }
      iVar16 = local_ce8 + iVar16;
      iVar8 = (*av1_block_error_lp)(local_c80,local_480,local_cb8);
      local_cb0->dist = local_cb0->dist + (iVar8 >> 2);
      uVar9 = (ulong)(uint)(local_cec + local_cf0);
      this_rdc = local_cb0;
      local_ce4 = uVar17;
    }
    local_d08 = (ulong)(uint)((int)local_d08 + local_cf4);
  }
  *local_ca0 = local_ce4;
  this_rdc->skip_txfm = (uint8_t)local_ce4;
  if (this_rdc->sse != 0x7fffffffffffffff) {
    lVar12 = (this_rdc->sse << 6) >> 2;
    this_rdc->sse = lVar12;
    if (local_ce4 != 0) {
      this_rdc->dist = lVar12;
      return;
    }
  }
  this_rdc->rate = iVar16 * 0x200 + this_rdc->rate * 0x800;
  return;
}

Assistant:

void av1_block_yrd_idtx(MACROBLOCK *x, const uint8_t *const pred_buf,
                        int pred_stride, RD_STATS *this_rdc, int *skippable,
                        BLOCK_SIZE bsize, TX_SIZE tx_size) {
  MACROBLOCKD *xd = &x->e_mbd;
  struct macroblock_plane *const p = &x->plane[AOM_PLANE_Y];
  assert(bsize < BLOCK_SIZES_ALL);
  const int num_4x4_w = mi_size_wide[bsize];
  const int num_4x4_h = mi_size_high[bsize];
  const int step = 1 << (tx_size << 1);
  const int block_step = (1 << tx_size);
  const int max_blocks_wide =
      num_4x4_w + (xd->mb_to_right_edge >= 0 ? 0 : xd->mb_to_right_edge >> 5);
  const int max_blocks_high =
      num_4x4_h + (xd->mb_to_bottom_edge >= 0 ? 0 : xd->mb_to_bottom_edge >> 5);
  int eob_cost = 0;
  const int bw = 4 * num_4x4_w;
  const int bh = 4 * num_4x4_h;
  const int num_blk_skip_w = num_4x4_w;
  // Keep the intermediate value on the stack here. Writing directly to
  // skippable causes speed regression due to load-and-store issues in
  // update_yrd_loop_vars.
  int temp_skippable = 1;
  int tx_wd = 0;
  const SCAN_ORDER *scan_order = NULL;
  switch (tx_size) {
    case TX_64X64:
      assert(0);  // Not implemented
      break;
    case TX_32X32:
      assert(0);  // Not used
      break;
    case TX_16X16:
      scan_order = &av1_fast_idtx_scan_order_16x16;
      tx_wd = 16;
      break;
    case TX_8X8:
      scan_order = &av1_fast_idtx_scan_order_8x8;
      tx_wd = 8;
      break;
    default:
      assert(tx_size == TX_4X4);
      scan_order = &av1_fast_idtx_scan_order_4x4;
      tx_wd = 4;
      break;
  }
  assert(scan_order != NULL);

  this_rdc->dist = 0;
  this_rdc->rate = 0;
  aom_subtract_block(bh, bw, p->src_diff, bw, p->src.buf, p->src.stride,
                     pred_buf, pred_stride);
  // Keep track of the row and column of the blocks we use so that we know
  // if we are in the unrestricted motion border.
  DECLARE_BLOCK_YRD_BUFFERS()
  DECLARE_BLOCK_YRD_VARS()
  for (int r = 0; r < max_blocks_high; r += block_step) {
    for (int c = 0, s = 0; c < max_blocks_wide; c += block_step, s += step) {
      DECLARE_LOOP_VARS_BLOCK_YRD()
      scale_square_buf_vals(low_coeff, tx_wd, src_diff, diff_stride);
      av1_quantize_lp(low_coeff, tx_wd * tx_wd, p->round_fp_QTX,
                      p->quant_fp_QTX, low_qcoeff, low_dqcoeff, p->dequant_QTX,
                      eob, scan_order->scan, scan_order->iscan);
      assert(*eob <= 1024);
      update_yrd_loop_vars(x, &temp_skippable, step, *eob, low_coeff,
                           low_qcoeff, low_dqcoeff, this_rdc, &eob_cost,
                           r * num_blk_skip_w + c);
    }
  }
  this_rdc->skip_txfm = *skippable = temp_skippable;
  if (this_rdc->sse < INT64_MAX) {
    this_rdc->sse = (this_rdc->sse << 6) >> 2;
    if (temp_skippable) {
      this_rdc->dist = 0;
      this_rdc->dist = this_rdc->sse;
      return;
    }
  }
  // If skippable is set, rate gets clobbered later.
  this_rdc->rate <<= (2 + AV1_PROB_COST_SHIFT);
  this_rdc->rate += (eob_cost << AV1_PROB_COST_SHIFT);
}